

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

void __thiscall
cmState::SetCacheEntryProperty(cmState *this,string *key,string *propertyName,string *value)

{
  CacheIterator it;
  CacheIterator local_20;
  
  local_20 = cmCacheManager::GetCacheIterator(this->CacheManager,(key->_M_dataplus)._M_p);
  cmCacheManager::CacheIterator::SetProperty(&local_20,propertyName,(value->_M_dataplus)._M_p);
  return;
}

Assistant:

void cmState::SetCacheEntryProperty(std::string const& key,
                            std::string const& propertyName,
                            std::string const& value)
{
  cmCacheManager::CacheIterator it =
      this->CacheManager->GetCacheIterator(key.c_str());
  it.SetProperty(propertyName, value.c_str());
}